

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VariableSymbols.cpp
# Opt level: O2

bool __thiscall
slang::ast::FormalArgumentSymbol::mergeVariable(FormalArgumentSymbol *this,VariableSymbol *variable)

{
  byte *pbVar1;
  SyntaxNode *pSVar2;
  
  if ((((this->mergedVar == (VariableSymbol *)0x0) &&
       (pSVar2 = ((this->super_VariableSymbol).super_ValueSymbol.super_Symbol.originatingSyntax)->
                 parent, pSVar2->kind == PortDeclaration)) &&
      (pSVar2 = pSVar2[3].parent, pSVar2[2].previewNode == (SyntaxNode *)0x0)) &&
     (**(int **)(pSVar2 + 3) == 0xf7)) {
    pbVar1 = (byte *)((long)&(this->super_VariableSymbol).super_ValueSymbol.declaredType.flags.
                             m_bits + 1);
    *pbVar1 = *pbVar1 | 1;
    this->mergedVar = variable;
    return true;
  }
  return false;
}

Assistant:

bool FormalArgumentSymbol::mergeVariable(const VariableSymbol& variable) {
    // If we've already merged one variable already, we can't do any more.
    if (mergedVar)
        return false;

    auto syntax = getSyntax();
    SLANG_ASSERT(syntax && syntax->parent);
    if (syntax->parent->kind != SyntaxKind::PortDeclaration)
        return false;

    auto& portDecl = syntax->parent->as<PortDeclarationSyntax>();
    auto& header = portDecl.header->as<VariablePortHeaderSyntax>();

    // If the port has a type declared this is already a full definition and
    // we shouldn't merge with any other variables (the caller will error for us).
    if (header.varKeyword || header.dataType->kind != SyntaxKind::ImplicitType)
        return false;

    // Save this variable reference; our DeclaredType will look into it later
    // when our type is fully resolved to merge in the variable's type info.
    getDeclaredType()->addFlags(DeclaredTypeFlags::FormalArgMergeVar);
    mergedVar = &variable;
    return true;
}